

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int randomx_blake2b_final(blake2b_state *S,void *out,size_t outlen)

{
  ulong in_RDX;
  void *in_RSI;
  blake2b_state *in_RDI;
  uint i;
  uint8_t buffer [64];
  uint8_t *in_stack_00000098;
  blake2b_state *in_stack_000000a0;
  uint64_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar1;
  undefined1 local_68 [72];
  ulong local_20;
  void *local_18;
  blake2b_state *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_68,0,0x40);
  if (((local_10 == (blake2b_state *)0x0) || (local_18 == (void *)0x0)) ||
     (local_20 < local_10->outlen)) {
    local_4 = -1;
  }
  else if (local_10->f[0] == 0) {
    blake2b_increment_counter(local_10,(ulong)local_10->buflen);
    blake2b_set_lastblock((blake2b_state *)0x150af0);
    memset(local_10->buf + local_10->buflen,0,(ulong)(0x80 - local_10->buflen));
    blake2b_compress(in_stack_000000a0,in_stack_00000098);
    for (uVar1 = 0; uVar1 < 8; uVar1 = uVar1 + 1) {
      store64((void *)CONCAT44(uVar1,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
    }
    memcpy(local_18,local_68,(ulong)local_10->outlen);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int blake2b_final(blake2b_state *S, void *out, size_t outlen) {
	uint8_t buffer[BLAKE2B_OUTBYTES] = { 0 };
	unsigned int i;

	/* Sanity checks */
	if (S == NULL || out == NULL || outlen < S->outlen) {
		return -1;
	}

	/* Is this a reused state? */
	if (S->f[0] != 0) {
		return -1;
	}

	blake2b_increment_counter(S, S->buflen);
	blake2b_set_lastblock(S);
	memset(&S->buf[S->buflen], 0, BLAKE2B_BLOCKBYTES - S->buflen); /* Padding */
	blake2b_compress(S, S->buf);

	for (i = 0; i < 8; ++i) { /* Output full hash to temp buffer */
		store64(buffer + sizeof(S->h[i]) * i, S->h[i]);
	}

	memcpy(out, buffer, S->outlen);
	//clear_internal_memory(buffer, sizeof(buffer));
	//clear_internal_memory(S->buf, sizeof(S->buf));
	//clear_internal_memory(S->h, sizeof(S->h));
	return 0;
}